

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::TimingControlExpressionSyntax::setChild
          (TimingControlExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
              ((not_null<slang::syntax::ExpressionSyntax*> *)&local_b8,
               (ExpressionSyntax **)&local_d8);
    (this->expr).ptr = (ExpressionSyntax *)local_b8._M_dataplus._M_p;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_58,&local_78,":");
      std::__cxx11::to_string(&local_98,0x3206);
      std::operator+(&local_38,&local_58,&local_98);
      std::operator+(&local_d8,&local_38,": ");
      std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_b8);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_d8._M_dataplus._M_p =
           (pointer)SyntaxNode::as<slang::syntax::TimingControlSyntax>(pSVar1);
    }
    not_null<slang::syntax::TimingControlSyntax*>::
    not_null<slang::syntax::TimingControlSyntax*,void>
              ((not_null<slang::syntax::TimingControlSyntax*> *)&local_b8,
               (TimingControlSyntax **)&local_d8);
    (this->timing).ptr = (TimingControlSyntax *)local_b8._M_dataplus._M_p;
  }
  return;
}

Assistant:

void TimingControlExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: timing = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 1: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}